

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::AtomicUsageTest<glcts::ArraysOfArrays::Interface::GL>::execute
          (AtomicUsageTest<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type,GLuint binding,GLuint offset,GLuint n_entries)

{
  TestError *this_00;
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  GLuint vao_id;
  GLuint texture_object_id;
  GLuint framebuffer_object_id;
  string valid_shader_source;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_data;
  string indent;
  string result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensions;
  string valid_definition;
  string indexing;
  string comment;
  string valid_iteration;
  string loop_end;
  GLuint buffer_object_id;
  string varying_definition;
  
  (*((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id)->m_renderCtx->
    _vptr_RenderContext[3])();
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  indent._M_string_length = 0;
  indent.field_2._M_local_buf[0] = '\0';
  indexing._M_dataplus._M_p = (pointer)&indexing.field_2;
  indexing._M_string_length = 0;
  indexing.field_2._M_local_buf[0] = '\0';
  loop_end._M_dataplus._M_p = (pointer)&loop_end.field_2;
  loop_end._M_string_length = 0;
  loop_end.field_2._M_local_buf[0] = '\0';
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  valid_shader_source._M_dataplus._M_p = (pointer)&valid_shader_source.field_2;
  valid_shader_source._M_string_length = 0;
  valid_shader_source.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valid_definition,execute::layout_binding,(allocator<char> *)&valid_iteration
            );
  valid_iteration._M_dataplus._M_p = (pointer)&valid_iteration.field_2;
  valid_iteration._M_string_length = 0;
  valid_iteration.field_2._M_local_buf[0] = '\0';
  varying_definition._M_dataplus._M_p = (pointer)&varying_definition.field_2;
  varying_definition._M_string_length = 0;
  varying_definition.field_2._M_local_buf[0] = '\0';
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&dimensions,8);
  prepareDimensions<glcts::ArraysOfArrays::Interface::GL>((ulong)n_entries,&dimensions);
  sprintf((char *)&buffer_data,"%u",(ulong)binding);
  std::__cxx11::string::append((char *)&valid_definition);
  std::__cxx11::string::append((char *)&valid_definition);
  sprintf((char *)&buffer_data,"%u",(ulong)offset);
  std::__cxx11::string::append((char *)&valid_definition);
  std::__cxx11::string::append((char *)&valid_definition);
  lVar2 = 7;
  uVar3 = 0;
  do {
    std::__cxx11::string::append((char *)&indent);
    std::__cxx11::string::replace((ulong)&loop_end,0,(char *)0x0,0x1be2b09);
    std::__cxx11::string::replace((ulong)&loop_end,0,(char *)0x0,(ulong)indent._M_dataplus._M_p);
    sprintf((char *)&buffer_data,"i%u",uVar3);
    std::__cxx11::string::append((char *)&indexing);
    std::__cxx11::string::append((char *)&indexing);
    std::__cxx11::string::append((char *)&indexing);
    sprintf((char *)&buffer_object_id,"%u",
            (ulong)(uint)dimensions.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar2]);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::_M_append((char *)&valid_iteration,(ulong)indent._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::_M_append((char *)&valid_iteration,(ulong)indent._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&valid_iteration);
    uVar3 = (ulong)((int)uVar3 + 1);
    bVar4 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar4);
  sprintf((char *)&buffer_data,"%u",(ulong)n_entries);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::append((char *)&comment);
  if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x213b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((ulong)tested_shader_type) {
  case 0:
    std::__cxx11::string::_M_replace((ulong)&result,0,(char *)result._M_string_length,0x1adf54e);
    pcVar1 = "out vec4 color;\n\n";
    break;
  default:
    pcVar1 = "    fs_result = result;\n";
    goto LAB_00b6cdf3;
  case 2:
    std::__cxx11::string::_M_replace((ulong)&result,0,(char *)result._M_string_length,0x1adf4fa);
    pcVar1 = "writeonly uniform image2D uni_image;\n\n";
    break;
  case 3:
    pcVar1 = 
    "    gl_Position  = vec4(-1, -1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n    gl_Position  = vec4(-1, 1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n    gl_Position  = vec4(1, -1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n    gl_Position  = vec4(1, 1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n"
    ;
LAB_00b6cdf3:
    std::__cxx11::string::_M_replace((ulong)&result,0,(char *)result._M_string_length,(ulong)pcVar1)
    ;
    pcVar1 = "out float fs_result;\n\n";
    break;
  case 4:
    std::__cxx11::string::_M_replace((ulong)&result,0,(char *)result._M_string_length,0x1adf6bc);
    pcVar1 = "out float tcs_result[];\n\n";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&varying_definition,0,(char *)varying_definition._M_string_length,(ulong)pcVar1)
  ;
  std::__cxx11::string::_M_append
            ((char *)&valid_shader_source,(ulong)varying_definition._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)comment._M_dataplus._M_p);
  std::__cxx11::string::_M_append
            ((char *)&valid_shader_source,(ulong)valid_definition._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append
            ((char *)&valid_shader_source,(ulong)valid_iteration._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)indent._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)indexing._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)loop_end._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)result._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,shader_end_abi_cxx11_);
  (*(code *)(&DAT_01ad4394 + *(int *)(&DAT_01ad4394 + (ulong)tested_shader_type * 4)))();
  return;
}

Assistant:

void AtomicUsageTest<API>::execute(typename TestCaseBase<API>::TestShaderType tested_shader_type, glw::GLuint binding,
								   glw::GLuint offset, glw::GLuint n_entries)
{
	static const char* indent_step		   = "    ";
	static const char* layout_binding	  = "layout(binding = ";
	static const char* layout_offset	   = ", offset = ";
	static const char* uniform_atomic_uint = ") uniform atomic_uint";

	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	std::string			comment;
	std::vector<size_t> dimensions;
	std::string			indent;
	std::string			indexing;
	std::string			loop_end;
	std::string			result;
	std::string			valid_shader_source;
	std::string			valid_definition = layout_binding;
	std::string			valid_iteration;
	std::string			varying_definition;

	dimensions.resize(API::MAX_ARRAY_DIMENSIONS);
	prepareDimensions<API>(n_entries, dimensions);

	/* Prepare parts of shader */

	/* Append binding */
	{
		char buffer[16];
		sprintf(buffer, "%u", static_cast<unsigned int>(binding));
		valid_definition += buffer;
		valid_definition += layout_offset;
		sprintf(buffer, "%u", static_cast<unsigned int>(offset));
		valid_definition += buffer;
		valid_definition += uniform_atomic_uint;
	}

	for (size_t i = API::MAX_ARRAY_DIMENSIONS; i != 0; --i)
	{
		char it[16];
		char max[16];

		indent += indent_step;

		loop_end.insert(0, "}\n");
		loop_end.insert(0, indent);

		sprintf(it, "i%u", (unsigned int)(API::MAX_ARRAY_DIMENSIONS - i));

		indexing += "[";
		indexing += it;
		indexing += "]";

		sprintf(max, "%u", (unsigned int)(dimensions[i - 1]));
		valid_definition += "[";
		valid_definition += max;
		valid_definition += "]";

		valid_iteration += indent;
		valid_iteration += "for (uint ";
		valid_iteration += it;
		valid_iteration += " = 0; ";
		valid_iteration += it;
		valid_iteration += " < ";
		valid_iteration += max;
		valid_iteration += "; ++";
		valid_iteration += it;
		valid_iteration += ")\n";
		valid_iteration += indent;
		valid_iteration += "{\n";
	}

	{
		char max[16];

		sprintf(max, "%u", (unsigned int)(n_entries));
		comment += "/* Number of atomic counters = ";
		comment += max;
		comment += " */\n";
	}

	/* Select varyings and result */
	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		result			   = "    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), vec4(result, 0, 0, 0));\n";
		varying_definition = "writeonly uniform image2D uni_image;\n"
							 "\n";
		break;

	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		result			   = "    color = vec4(result);\n";
		varying_definition = "out vec4 color;\n"
							 "\n";
		break;

	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		result = "    gl_Position  = vec4(-1, -1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n"
				 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n"
				 "    gl_Position  = vec4(1, -1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n"
				 "    gl_Position  = vec4(1, 1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n";
		varying_definition = "out float fs_result;\n"
							 "\n";
		break;

	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		result = "    tcs_result[gl_InvocationID] = result;\n"
				 "\n"
				 "    gl_TessLevelOuter[0] = 1.0;\n"
				 "    gl_TessLevelOuter[1] = 1.0;\n"
				 "    gl_TessLevelOuter[2] = 1.0;\n"
				 "    gl_TessLevelOuter[3] = 1.0;\n"
				 "    gl_TessLevelInner[0] = 1.0;\n"
				 "    gl_TessLevelInner[1] = 1.0;\n";
		varying_definition = "out float tcs_result[];\n"
							 "\n";
		break;

	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		result			   = "    fs_result = result;\n";
		varying_definition = "out float fs_result;\n"
							 "\n";
		break;

	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		result			   = "    fs_result = result;\n";
		varying_definition = "out float fs_result;\n"
							 "\n";
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	};

	/* Prepare valid source */
	valid_shader_source += varying_definition;
	valid_shader_source += comment;
	valid_shader_source += valid_definition;
	valid_shader_source += " a;\n\nvoid main()\n{\n    uint sum = 0u;\n";
	valid_shader_source += valid_iteration;
	valid_shader_source += indent;
	valid_shader_source += indent_step;
	valid_shader_source += "sum += atomicCounterIncrement( a";
	valid_shader_source += indexing;
	valid_shader_source += " );\n";
	valid_shader_source += loop_end;
	valid_shader_source += "\n"
						   "    float result = 0.0;\n"
						   "\n"
						   "    if (16u < sum)\n"
						   "    {\n"
						   "         result = 1.0;\n"
						   "    }\n";
	valid_shader_source += result;
	valid_shader_source += shader_end;

	/* Build program */
	{
		const std::string* cs  = &empty_string;
		const std::string* vs  = &default_vertex_shader_source;
		const std::string* tcs = &empty_string;
		const std::string* tes = &empty_string;
		const std::string* gs  = &empty_string;
		const std::string* fs  = &pass_fragment_shader_source;

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
			cs = &valid_shader_source;
			vs = &empty_string;
			fs = &empty_string;
			break;

		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
			fs = &valid_shader_source;
			break;

		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
			gs = &valid_shader_source;
			break;

		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
			tcs = &valid_shader_source;
			tes = &pass_te_shader_source;
			break;

		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			tcs = &default_tc_shader_source;
			tes = &valid_shader_source;
			break;

		case TestCaseBase<API>::VERTEX_SHADER_TYPE:
			vs = &valid_shader_source;
			break;

		default:
			TCU_FAIL("Invalid enum");
			break;
		};

		if (API::USE_ALL_SHADER_STAGES)
		{
			this->execute_positive_test(*vs, *tcs, *tes, *gs, *fs, *cs, false, false);
		}
		else
		{
			this->execute_positive_test(*vs, *fs, false, false);
		}
	}

	gl.useProgram(this->program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

	/* Prepare buffer */
	glw::GLuint				 buffer_object_id = 0;
	std::vector<glw::GLuint> buffer_data;
	const size_t			 start_pos		  = offset / 4;
	const size_t			 last_pos		  = start_pos + n_entries;
	const size_t			 buffer_data_size = last_pos * sizeof(glw::GLuint);

	gl.genBuffers(1, &buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed.");

	gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed.");

	buffer_data.resize(start_pos + n_entries);
	for (size_t i = 0; i < n_entries; ++i)
	{
		buffer_data[start_pos + i] = (glw::GLuint)i;
	}

	gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, buffer_data_size, &buffer_data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

	gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, binding, buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed.");

	/* Run program */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		glw::GLuint framebuffer_object_id = 0;
		glw::GLuint texture_object_id	 = 0;
		glw::GLuint vao_id				  = 0;

		gl.genTextures(1, &texture_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed.");

		gl.bindTexture(GL_TEXTURE_2D, texture_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() failed.");

		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() failed.");

		gl.genFramebuffers(1, &framebuffer_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() failed.");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() failed.");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture_object_id, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() failed.");

		gl.viewport(0, 0, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() failed.");

		gl.genVertexArrays(1, &vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() failed.");

		gl.bindVertexArray(vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() failed.");

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
			gl.drawArrays(GL_POINTS, 0, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
			break;

		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			/* Tesselation patch set up */
			gl.patchParameteri(GL_PATCH_VERTICES, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "PatchParameteri");

			gl.drawArrays(GL_PATCHES, 0, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
			break;

		default:
			TCU_FAIL("Invalid enum");
			break;
		}

		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier.");

		gl.bindTexture(GL_TEXTURE_2D, 0);
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteTextures(1, &texture_object_id);
		gl.deleteFramebuffers(1, &framebuffer_object_id);
		gl.deleteVertexArrays(1, &vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "An error ocurred while deleting generated objects.");
	}
	else
	{
		gl.dispatchCompute(1, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");

		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier.");
	}

	/* Verify results */
	bool test_result = true;

	const glw::GLuint* results =
		(glw::GLuint*)gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0 /* offset */, buffer_data_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBufferRange");

	/* Anything before start position should be 0 */
	for (size_t i = 0; i < start_pos; ++i)
	{
		if (0 != results[i])
		{
			test_result = false;
			break;
		}
	}

	/* Anything from start_pos should be incremented by 1 */
	int diff = 0;
	for (size_t i = 0; i < n_entries; ++i)
	{
		/* Tesselation evaluation can be called several times
		 In here, check the increment is consistent over all results.
		 */
		if (tested_shader_type == TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE)
		{
			if (i == 0)
			{
				diff = static_cast<int>(results[i + start_pos]) - static_cast<int>(i);
				if (diff <= 0)
				{
					test_result = false;
					break;
				}
			}
			else if ((static_cast<int>(results[i + start_pos]) - static_cast<int>(i)) != diff)
			{
				test_result = false;
				break;
			}
		}
		else
		{
			if (i + 1 != results[i + start_pos])
			{
				test_result = false;
				break;
			}
		}
	}

	gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Deallocate any resources used. */
	gl.deleteBuffers(1, &buffer_object_id);
	this->delete_objects();

	if (false == test_result)
	{
		TCU_FAIL("Invalid results.");
	}
}